

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O2

void __thiscall tcu::TestNode::deinit(TestNode *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    ppTVar1 = (this->m_children).
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppTVar2 = (this->m_children).
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppTVar2 - (long)ppTVar1) >> 3) <= lVar3) break;
    if (ppTVar1[lVar3] != (TestNode *)0x0) {
      (*ppTVar1[lVar3]->_vptr_TestNode[1])();
    }
    lVar3 = lVar3 + 1;
  }
  if (ppTVar2 != ppTVar1) {
    (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppTVar1;
  }
  return;
}

Assistant:

void TestNode::deinit (void)
{
	for (int i = 0; i < (int)m_children.size(); i++)
		delete m_children[i];
	m_children.clear();
}